

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O3

bool sc_dt::operator<(long u,sc_signed *v)

{
  sc_digit *psVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  sc_digit ud [3];
  uint auStack_1c [3];
  
  iVar10 = 1;
  uVar5 = u;
  if (u < 1) {
    if (u != 0) {
      uVar5 = -u;
      if ((ulong)u < 0x8000000000000001) {
        uVar5 = 0x8000000000000000;
      }
      iVar10 = -1;
      goto LAB_001daeb3;
    }
    iVar10 = 0;
    uVar7 = 0;
  }
  else {
LAB_001daeb3:
    uVar7 = 0;
    do {
      uVar6 = uVar7;
      uVar7 = uVar6 + 1;
      auStack_1c[uVar6] = (uint)uVar5 & 0x3fffffff;
      if (1 < uVar6) break;
      bVar4 = 0x3fffffff < uVar5;
      uVar5 = uVar5 >> 0x1e;
    } while (bVar4);
    if (1 < uVar6) goto LAB_001daf0c;
  }
  memset(auStack_1c + (uVar7 & 0xffffffff),0,(ulong)(2 - (int)uVar7) * 4 + 4);
LAB_001daf0c:
  bVar4 = true;
  if (v->sgn <= iVar10) {
    if (iVar10 <= v->sgn) {
      if (iVar10 == -1) {
        uVar9 = v->ndigits;
        psVar1 = v->digit;
        uVar5 = 2;
        uVar8 = 4;
        do {
          if (uVar5 == 0xffffffffffffffff) {
            uVar8 = 0;
            break;
          }
          uVar7 = uVar5 & 0xffffffff;
          uVar5 = uVar5 - 1;
          uVar8 = uVar8 - 1;
        } while (auStack_1c[uVar7] == 0);
        uVar11 = (int)uVar9 >> 0x1f & uVar9;
        uVar12 = uVar9 + 1;
        do {
          uVar13 = uVar11;
          if ((int)uVar9 < 1) break;
          uVar9 = uVar9 - 1;
          uVar12 = uVar12 - 1;
          uVar13 = uVar12;
        } while (psVar1[uVar9] == 0);
        iVar10 = uVar8 - uVar13;
        if (iVar10 == 0) {
          uVar5 = (ulong)uVar8;
          do {
            if ((long)uVar5 < 1) goto LAB_001db02d;
            uVar7 = uVar5 - 1;
            lVar3 = uVar5 - 1;
            lVar2 = uVar5 - 1;
            uVar5 = uVar7;
          } while (auStack_1c[lVar3] == psVar1[lVar2]);
          uVar7 = uVar7 & 0xffffffff;
          iVar10 = auStack_1c[uVar7] - psVar1[uVar7];
        }
        if (0 < iVar10) {
          return true;
        }
      }
      else if (iVar10 == 1) {
        uVar9 = v->ndigits;
        psVar1 = v->digit;
        uVar5 = 2;
        uVar8 = 4;
        do {
          if (uVar5 == 0xffffffffffffffff) {
            uVar8 = 0;
            break;
          }
          uVar7 = uVar5 & 0xffffffff;
          uVar5 = uVar5 - 1;
          uVar8 = uVar8 - 1;
        } while (auStack_1c[uVar7] == 0);
        uVar11 = (int)uVar9 >> 0x1f & uVar9;
        uVar12 = uVar9 + 1;
        do {
          uVar13 = uVar11;
          if ((int)uVar9 < 1) break;
          uVar9 = uVar9 - 1;
          uVar12 = uVar12 - 1;
          uVar13 = uVar12;
        } while (psVar1[uVar9] == 0);
        iVar10 = uVar8 - uVar13;
        if (iVar10 == 0) {
          uVar5 = (ulong)uVar8;
          do {
            if ((long)uVar5 < 1) goto LAB_001db02d;
            uVar7 = uVar5 - 1;
            lVar3 = uVar5 - 1;
            lVar2 = uVar5 - 1;
            uVar5 = uVar7;
          } while (auStack_1c[lVar3] == psVar1[lVar2]);
          uVar7 = uVar7 & 0xffffffff;
          iVar10 = auStack_1c[uVar7] - psVar1[uVar7];
        }
        if (iVar10 < 0) {
          return true;
        }
      }
    }
LAB_001db02d:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool
operator<(long u, const sc_signed& v)
{
  CONVERT_LONG(u);

  if (us < v.sgn)
    return true;

  if (us > v.sgn)
    return false;

  // us == v.sgn

  if (us == SC_POS) {

    if (vec_skip_and_cmp(DIGITS_PER_LONG, ud, v.ndigits, v.digit) < 0)
      return true;

  }
  else if (us == SC_NEG) {

    if (vec_skip_and_cmp(DIGITS_PER_LONG, ud, v.ndigits, v.digit) > 0)
      return true;

  }

  return false;
}